

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

ExprList * sqlite3ExprListAppendVector(Parse *pParse,ExprList *pList,IdList *pColumns,Expr *pExpr)

{
  sqlite3 *db;
  IdList_item *pIVar1;
  u8 uVar2;
  int iVar3;
  Select *pSVar4;
  Expr *pEVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  if (pList == (ExprList *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar7 = (long)pList->nExpr;
  }
  db = pParse->db;
  if (pExpr == (Expr *)0x0 || pColumns == (IdList *)0x0) goto LAB_00153ea2;
  uVar2 = pExpr->op;
  if (uVar2 != 'w') {
    if (uVar2 == 0x9d) {
      uVar2 = pExpr->op2;
    }
    if (uVar2 == 'w') {
      pSVar4 = (pExpr->x).pSelect;
LAB_00153dee:
      iVar3 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar4->pEList)->pList->nExpr;
    }
    else {
      iVar3 = 1;
      if (uVar2 == 0x9e) {
        pSVar4 = (Select *)&pExpr->x;
        goto LAB_00153dee;
      }
    }
    if (pColumns->nId != iVar3) {
      sqlite3ErrorMsg(pParse,"%d columns assigned %d values");
      goto LAB_00153ea2;
    }
  }
  iVar3 = pColumns->nId;
  if (0 < iVar3) {
    lVar8 = 0;
    lVar6 = 0;
    do {
      pEVar5 = sqlite3ExprForVectorField(pParse,pExpr,(int)lVar6);
      pList = sqlite3ExprListAppend(pParse,pList,pEVar5);
      if (pList != (ExprList *)0x0) {
        pIVar1 = pColumns->a;
        pList->a[(long)pList->nExpr + -1].zName = *(char **)((long)&pIVar1->zName + lVar8);
        *(undefined8 *)((long)&pIVar1->zName + lVar8) = 0;
      }
      lVar6 = lVar6 + 1;
      iVar3 = pColumns->nId;
      lVar8 = lVar8 + 0x10;
    } while (lVar6 < iVar3);
  }
  if (((db->mallocFailed == '\0') && (pList != (ExprList *)0x0)) && (pExpr->op == 'w')) {
    pEVar5 = pList->a[lVar7].pExpr;
    pEVar5->pRight = pExpr;
    pEVar5->iTable = iVar3;
    pExpr = (Expr *)0x0;
  }
LAB_00153ea2:
  if (pExpr != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pExpr);
  }
  sqlite3IdListDelete(db,pColumns);
  return pList;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListAppendVector(
  Parse *pParse,         /* Parsing context */
  ExprList *pList,       /* List to which to append. Might be NULL */
  IdList *pColumns,      /* List of names of LHS of the assignment */
  Expr *pExpr            /* Vector expression to be appended. Might be NULL */
){
  sqlite3 *db = pParse->db;
  int n;
  int i;
  int iFirst = pList ? pList->nExpr : 0;
  /* pColumns can only be NULL due to an OOM but an OOM will cause an
  ** exit prior to this routine being invoked */
  if( NEVER(pColumns==0) ) goto vector_append_error;
  if( pExpr==0 ) goto vector_append_error;

  /* If the RHS is a vector, then we can immediately check to see that 
  ** the size of the RHS and LHS match.  But if the RHS is a SELECT, 
  ** wildcards ("*") in the result set of the SELECT must be expanded before
  ** we can do the size check, so defer the size check until code generation.
  */
  if( pExpr->op!=TK_SELECT && pColumns->nId!=(n=sqlite3ExprVectorSize(pExpr)) ){
    sqlite3ErrorMsg(pParse, "%d columns assigned %d values",
                    pColumns->nId, n);
    goto vector_append_error;
  }

  for(i=0; i<pColumns->nId; i++){
    Expr *pSubExpr = sqlite3ExprForVectorField(pParse, pExpr, i);
    pList = sqlite3ExprListAppend(pParse, pList, pSubExpr);
    if( pList ){
      assert( pList->nExpr==iFirst+i+1 );
      pList->a[pList->nExpr-1].zName = pColumns->a[i].zName;
      pColumns->a[i].zName = 0;
    }
  }

  if( !db->mallocFailed && pExpr->op==TK_SELECT && ALWAYS(pList!=0) ){
    Expr *pFirst = pList->a[iFirst].pExpr;
    assert( pFirst!=0 );
    assert( pFirst->op==TK_SELECT_COLUMN );
     
    /* Store the SELECT statement in pRight so it will be deleted when
    ** sqlite3ExprListDelete() is called */
    pFirst->pRight = pExpr;
    pExpr = 0;

    /* Remember the size of the LHS in iTable so that we can check that
    ** the RHS and LHS sizes match during code generation. */
    pFirst->iTable = pColumns->nId;
  }

vector_append_error:
  sqlite3ExprDelete(db, pExpr);
  sqlite3IdListDelete(db, pColumns);
  return pList;
}